

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O3

void __thiscall Math_ErfInv_Test::TestBody(Math_ErfInv_Test *this)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  Float ei;
  AssertionResult gtest_ar;
  Float err;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  float local_5c;
  float local_58;
  float local_54;
  internal local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  float local_3c;
  AssertHelper local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  lVar3 = 0;
  do {
    local_58 = *(float *)((long)&DAT_0060aec0 + lVar3);
    auVar6._0_4_ = erff(local_58);
    auVar6._4_60_ = extraout_var;
    if (auVar6._0_4_ < 1.0) {
      auVar4 = vfnmadd213ss_fma(auVar6._0_16_,auVar6._0_16_,ZEXT416(0x3f800000));
      auVar4 = vmaxss_avx(SUB6416(ZEXT464(0x800000),0),auVar4);
      local_5c = auVar6._0_4_;
      auVar7._0_4_ = logf(auVar4._0_4_);
      auVar7._4_60_ = extraout_var_00;
      if (0x7f7fffff < (uint)ABS(auVar7._0_4_)) {
        pbrt::LogFatal<char_const(&)[28]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math.h"
                   ,0x2e5,"Check failed: %s",(char (*) [28])"!IsNaN(t) && !std::isinf(t)");
      }
      auVar4._8_4_ = 0x7fffffff;
      auVar4._0_8_ = 0x7fffffff7fffffff;
      auVar4._12_4_ = 0x7fffffff;
      auVar5 = auVar7._0_16_;
      auVar4 = vandps_avx512vl(auVar5,auVar4);
      if (auVar4._0_4_ <= 6.125) {
        auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x31bae000),0),auVar5,ZEXT416(0x3419da2c));
        auVar4 = vfmadd213ss_fma(auVar4,auVar5,ZEXT416(0x35a4c94e));
        auVar4 = vfmadd213ss_fma(auVar4,auVar5,ZEXT416(0x33f295dd));
        auVar4 = vfmadd213ss_fma(auVar4,auVar5,ZEXT416(0xb86b8609));
        auVar4 = vfmadd213ss_fma(auVar4,auVar5,ZEXT416(0xb91adf4d));
        auVar4 = vfmadd213ss_fma(auVar4,auVar5,ZEXT416(0x3b17b201));
        auVar4 = vfmadd213ss_fma(auVar4,auVar5,ZEXT416(0x3c3d0f26));
        auVar4 = vfmadd213ss_fma(auVar4,auVar5,ZEXT416(0xbe6d9577));
        auVar4 = vfmadd213ss_fma(auVar4,auVar5,ZEXT416(0x3f62dfc4));
        local_54 = auVar4._0_4_;
      }
      else {
        auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x2fa6f5a2),0),auVar5,ZEXT416(0x32fbe4d7));
        auVar4 = vfmadd213ss_fma(auVar4,auVar5,ZEXT416(0x35a3f289));
        auVar4 = vfmadd213ss_fma(auVar4,auVar5,ZEXT416(0x37ee53ef));
        auVar4 = vfmadd213ss_fma(auVar4,auVar5,ZEXT416(0x39ce55c9));
        auVar4 = vfmadd213ss_fma(auVar4,auVar5,ZEXT416(0x3b46606f));
        auVar4 = vfmadd213ss_fma(auVar4,auVar5,ZEXT416(0x3b9e5490));
        auVar4 = vfmadd213ss_fma(auVar4,auVar5,ZEXT416(0xbe877fb3));
        auVar4 = vfmadd213ss_fma(auVar4,auVar5,ZEXT416(0x3f570b52));
        local_54 = auVar4._0_4_;
      }
      local_54 = local_54 * local_5c;
      if ((local_58 != 0.0) || (NAN(local_58))) {
        auVar5._8_4_ = 0x7fffffff;
        auVar5._0_8_ = 0x7fffffff7fffffff;
        auVar5._12_4_ = 0x7fffffff;
        auVar4 = vandps_avx512vl(ZEXT416((uint)(local_54 - local_58)),auVar5);
        local_68.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &DAT_3f1a36e2eb1c432d;
        local_3c = auVar4._0_4_ / local_58;
        testing::internal::CmpHelperLT<float,double>
                  (local_50,"err","1e-4",&local_3c,(double *)&local_68);
        if (local_50[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_68);
          std::ostream::_M_insert<double>((double)local_58);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_68.ptr_ + 0x10)," erf ",5);
          std::ostream::_M_insert<double>((double)local_5c);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_68.ptr_ + 0x10)," inv ",5);
          std::ostream::_M_insert<double>((double)local_54);
          pcVar2 = "";
          if (local_48.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = ((local_48.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
                     ,0xfa,pcVar2);
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_68);
          testing::internal::AssertHelper::~AssertHelper(&local_38);
          if (local_68.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_68.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_68.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        local_68.ptr_ = local_68.ptr_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,float>(local_50,"0","ei",(int *)&local_68,&local_54);
        if (local_50[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_68);
          pcVar2 = "";
          if (local_48.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = ((local_48.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
                     ,0xf7,pcVar2);
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_68);
          testing::internal::AssertHelper::~AssertHelper(&local_38);
          if (local_68.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_68.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_68.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x18);
  return;
}

Assistant:

TEST(Math, ErfInv) {
    float xvl[] = {0., 0.1125, 0.25, .753, 1.521, 2.5115};
    for (float x : xvl) {
        Float e = std::erf(x);
        if (e < 1) {
            Float ei = ErfInv(e);
            if (x == 0)
                EXPECT_EQ(0, ei);
            else {
                Float err = std::abs(ei - x) / x;
                EXPECT_LT(err, 1e-4) << x << " erf " << e << " inv " << ei;
            }
        }
    }
}